

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Connection *c)

{
  bool bVar1;
  Expression *pEVar2;
  Constant *pCVar3;
  Constant *pCVar4;
  pool_ptr<soul::AST::Constant> local_20;
  pool_ptr<soul::AST::Constant> cv;
  Connection *c_local;
  PostResolutionChecks *this_local;
  
  cv.object = (Constant *)c;
  ASTVisitor::visit(&this->super_ASTVisitor,c);
  bVar1 = pool_ptr<soul::AST::Expression>::operator!=
                    ((pool_ptr<soul::AST::Expression> *)&((cv.object)->value).type.structure,
                     (void *)0x0);
  if (bVar1) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator*
                       ((pool_ptr<soul::AST::Expression> *)&((cv.object)->value).type.structure);
    throwErrorIfNotReadableValue(pEVar2);
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->
                       ((pool_ptr<soul::AST::Expression> *)&((cv.object)->value).type.structure);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_20);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_20);
    if (bVar1) {
      pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_20);
      pCVar4 = pool_ptr<soul::AST::Constant>::operator->(&local_20);
      checkDelayLineLength
                (&(pCVar3->super_Expression).super_Statement.super_ASTObject.context,&pCVar4->value)
      ;
    }
    pool_ptr<soul::AST::Constant>::~pool_ptr(&local_20);
  }
  return;
}

Assistant:

void visit (AST::Connection& c) override
        {
            super::visit (c);

            if (c.delayLength != nullptr)
            {
                throwErrorIfNotReadableValue (*c.delayLength);

                if (auto cv = c.delayLength->getAsConstant())
                    checkDelayLineLength (cv->context, cv->value);
            }
        }